

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animations.cpp
# Opt level: O0

FDoorAnimation * __thiscall
FTextureManager::FindAnimatedDoor(FTextureManager *this,FTextureID picnum)

{
  bool bVar1;
  uint uVar2;
  FDoorAnimation *pFVar3;
  uint local_24;
  uint i;
  FTextureManager *this_local;
  FTextureID picnum_local;
  
  local_24 = 0;
  this_local._4_4_ = picnum.texnum;
  while( true ) {
    uVar2 = TArray<FDoorAnimation,_FDoorAnimation>::Size(&this->mAnimatedDoors);
    if (uVar2 <= local_24) {
      return (FDoorAnimation *)0x0;
    }
    pFVar3 = TArray<FDoorAnimation,_FDoorAnimation>::operator[]
                       (&this->mAnimatedDoors,(ulong)local_24);
    bVar1 = FTextureID::operator==((FTextureID *)((long)&this_local + 4),&pFVar3->BaseTexture);
    if (bVar1) break;
    local_24 = local_24 + 1;
  }
  pFVar3 = TArray<FDoorAnimation,_FDoorAnimation>::operator[](&this->mAnimatedDoors,(ulong)local_24)
  ;
  return pFVar3;
}

Assistant:

FDoorAnimation *FTextureManager::FindAnimatedDoor (FTextureID picnum)
{
	unsigned int i;

	for (i = 0; i < mAnimatedDoors.Size(); ++i)
	{
		if (picnum == mAnimatedDoors[i].BaseTexture)
			return &mAnimatedDoors[i];
	}

	return NULL;
}